

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O2

void llvm::yaml::MappingTraits<llvm::DWARFYAML::Data>::mapping(IO *IO,Data *DWARF)

{
  int iVar1;
  void *local_20;
  void *oldContext;
  
  local_20 = yaml::IO::getContext(IO);
  yaml::IO::setContext(IO,DWARF);
  yaml::IO::mapOptional<std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>>
            (IO,"debug_str",&DWARF->DebugStrings);
  yaml::IO::
  mapOptional<std::vector<llvm::DWARFYAML::Abbrev,std::allocator<llvm::DWARFYAML::Abbrev>>>
            (IO,"debug_abbrev",&DWARF->AbbrevDecls);
  if ((DWARF->ARanges).
      super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (DWARF->ARanges).
      super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 == '\0') goto LAB_00b574e6;
  }
  else {
LAB_00b574e6:
    yaml::IO::
    mapOptional<std::vector<llvm::DWARFYAML::ARange,std::allocator<llvm::DWARFYAML::ARange>>>
              (IO,"debug_aranges",&DWARF->ARanges);
  }
  if ((DWARF->PubNames).Entries.
      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (DWARF->PubNames).Entries.
      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 == '\0') goto LAB_00b57516;
  }
  else {
LAB_00b57516:
    yaml::IO::mapOptional<llvm::DWARFYAML::PubSection>(IO,"debug_pubnames",&DWARF->PubNames);
  }
  if ((DWARF->PubTypes).Entries.
      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (DWARF->PubTypes).Entries.
      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 == '\0') goto LAB_00b57549;
  }
  else {
LAB_00b57549:
    yaml::IO::mapOptional<llvm::DWARFYAML::PubSection>(IO,"debug_pubtypes",&DWARF->PubTypes);
  }
  if ((DWARF->GNUPubNames).Entries.
      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (DWARF->GNUPubNames).Entries.
      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 == '\0') goto LAB_00b5757c;
  }
  else {
LAB_00b5757c:
    yaml::IO::mapOptional<llvm::DWARFYAML::PubSection>(IO,"debug_gnu_pubnames",&DWARF->GNUPubNames);
  }
  if ((DWARF->GNUPubTypes).Entries.
      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (DWARF->GNUPubTypes).Entries.
      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 != '\0') goto LAB_00b575c5;
  }
  yaml::IO::mapOptional<llvm::DWARFYAML::PubSection>(IO,"debug_gnu_pubtypes",&DWARF->GNUPubTypes);
LAB_00b575c5:
  yaml::IO::mapOptional<std::vector<llvm::DWARFYAML::Unit,std::allocator<llvm::DWARFYAML::Unit>>>
            (IO,"debug_info",&DWARF->CompileUnits);
  yaml::IO::
  mapOptional<std::vector<llvm::DWARFYAML::LineTable,std::allocator<llvm::DWARFYAML::LineTable>>>
            (IO,"debug_line",&DWARF->DebugLines);
  yaml::IO::setContext(IO,&local_20);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::Data>::mapping(IO &IO, DWARFYAML::Data &DWARF) {
  auto oldContext = IO.getContext();
  IO.setContext(&DWARF);
  IO.mapOptional("debug_str", DWARF.DebugStrings);
  IO.mapOptional("debug_abbrev", DWARF.AbbrevDecls);
  if (!DWARF.ARanges.empty() || !IO.outputting())
    IO.mapOptional("debug_aranges", DWARF.ARanges);
  if (!DWARF.PubNames.Entries.empty() || !IO.outputting())
    IO.mapOptional("debug_pubnames", DWARF.PubNames);
  if (!DWARF.PubTypes.Entries.empty() || !IO.outputting())
    IO.mapOptional("debug_pubtypes", DWARF.PubTypes);
  if (!DWARF.GNUPubNames.Entries.empty() || !IO.outputting())
    IO.mapOptional("debug_gnu_pubnames", DWARF.GNUPubNames);
  if (!DWARF.GNUPubTypes.Entries.empty() || !IO.outputting())
    IO.mapOptional("debug_gnu_pubtypes", DWARF.GNUPubTypes);
  IO.mapOptional("debug_info", DWARF.CompileUnits);
  IO.mapOptional("debug_line", DWARF.DebugLines);
  IO.setContext(&oldContext);
}